

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

void sk_addrcopy(SockAddr *addr,char *buf)

{
  addrinfo *paVar1;
  undefined8 uVar2;
  
  if (UNIX < addr->superfamily) {
    paVar1 = addr->ais;
    if (paVar1 != (addrinfo *)0x0) {
      if (paVar1->ai_family == 10) {
        uVar2 = *(undefined8 *)(paVar1->ai_addr + 1);
        *(undefined8 *)buf = *(undefined8 *)(paVar1->ai_addr->sa_data + 6);
        *(undefined8 *)(buf + 8) = uVar2;
        return;
      }
      if (paVar1->ai_family != 2) goto LAB_0013d3a2;
    }
    *(undefined4 *)buf = *(undefined4 *)(paVar1->ai_addr->sa_data + 2);
    return;
  }
LAB_0013d3a2:
  __assert_fail("false && \"bad address family in sk_addrcopy\"",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/network.c",
                0x1c0,"void sk_addrcopy(SockAddr *, char *)");
}

Assistant:

void sk_addrcopy(SockAddr *addr, char *buf)
{
    SockAddrStep step;
    int family;
    START_STEP(addr, step);
    family = SOCKADDR_FAMILY(addr, step);

#ifndef NO_IPV6
    if (family == AF_INET)
        memcpy(buf, &((struct sockaddr_in *)step.ai->ai_addr)->sin_addr,
               sizeof(struct in_addr));
    else if (family == AF_INET6)
        memcpy(buf, &((struct sockaddr_in6 *)step.ai->ai_addr)->sin6_addr,
               sizeof(struct in6_addr));
    else
        unreachable("bad address family in sk_addrcopy");
#else
    struct in_addr a;

    assert(family == AF_INET);
    a.s_addr = htonl(addr->addresses[step.curraddr]);
    memcpy(buf, (char*) &a.s_addr, 4);
#endif
}